

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  XmlUnitTestResultPrinter *this;
  string *__return_storage_ptr__;
  bool bVar1;
  int line;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  internal *piVar5;
  TestPartResult *this_00;
  char *data;
  TimeInMillis ms;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  undefined1 local_98 [16];
  string local_88;
  undefined1 local_68 [16];
  XmlUnitTestResultPrinter local_58;
  XmlUnitTestResultPrinter local_38;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  result = (TestResult *)test_info;
  test_info_local = (TestInfo *)test_case_name;
  test_case_name_local = (char *)stream;
  local_38.output_file_.length_ = (size_t)TestInfo::result(test_info);
  poVar3 = std::operator<<((ostream *)test_case_name_local,"    <testcase name=\"");
  pcVar4 = TestInfo::name((TestInfo *)result);
  EscapeXmlAttribute(&local_38,pcVar4);
  pcVar4 = String::c_str((String *)&local_38);
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,"\"");
  String::~String((String *)&local_38);
  pcVar4 = TestInfo::value_param((TestInfo *)result);
  if (pcVar4 != (char *)0x0) {
    poVar3 = std::operator<<((ostream *)test_case_name_local," value_param=\"");
    pcVar4 = TestInfo::value_param((TestInfo *)result);
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)(local_68 + 0x10),pcVar4);
    poVar3 = internal::operator<<(poVar3,(String *)(local_68 + 0x10));
    std::operator<<(poVar3,"\"");
    String::~String((String *)(local_68 + 0x10));
  }
  pcVar4 = TestInfo::type_param((TestInfo *)result);
  if (pcVar4 != (char *)0x0) {
    poVar3 = std::operator<<((ostream *)test_case_name_local," type_param=\"");
    pcVar4 = TestInfo::type_param((TestInfo *)result);
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_68,pcVar4);
    poVar3 = internal::operator<<(poVar3,(String *)local_68);
    std::operator<<(poVar3,"\"");
    String::~String((String *)local_68);
  }
  poVar3 = std::operator<<((ostream *)test_case_name_local," status=\"");
  bVar1 = TestInfo::should_run((TestInfo *)result);
  pcVar4 = "notrun";
  if (bVar1) {
    pcVar4 = "run";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"\" time=\"");
  piVar5 = (internal *)TestResult::elapsed_time((TestResult *)local_38.output_file_.length_);
  FormatTimeInMillisAsSeconds_abi_cxx11_((string *)(local_98 + 0x10),piVar5,ms);
  poVar3 = std::operator<<(poVar3,(string *)(local_98 + 0x10));
  poVar3 = std::operator<<(poVar3,"\" classname=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_98,(char *)test_info_local);
  pcVar4 = String::c_str((String *)local_98);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"\"");
  TestPropertiesAsXmlAttributes
            ((XmlUnitTestResultPrinter *)&i,(TestResult *)local_38.output_file_.length_);
  pcVar4 = String::c_str((String *)&i);
  std::operator<<(poVar3,pcVar4);
  String::~String((String *)&i);
  String::~String((String *)local_98);
  std::__cxx11::string::~string((string *)(local_98 + 0x10));
  part._4_4_ = 0;
  for (part._0_4_ = 0;
      line = TestResult::total_part_count((TestResult *)local_38.output_file_.length_),
      (int)part < line; part._0_4_ = (int)part + 1) {
    this_00 = TestResult::GetTestPartResult((TestResult *)local_38.output_file_.length_,(int)part);
    bVar1 = TestPartResult::failed(this_00);
    if (bVar1) {
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        std::operator<<((ostream *)test_case_name_local,">\n");
      }
      poVar3 = std::operator<<((ostream *)test_case_name_local,"      <failure message=\"");
      pcVar4 = TestPartResult::summary(this_00);
      this = (XmlUnitTestResultPrinter *)((long)&location.field_2 + 8);
      EscapeXmlAttribute(this,pcVar4);
      pcVar4 = String::c_str((String *)this);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3,"\" type=\"\">");
      String::~String((String *)((long)&location.field_2 + 8));
      piVar5 = (internal *)TestPartResult::file_name(this_00);
      uVar2 = TestPartResult::line_number(this_00);
      __return_storage_ptr__ = (string *)((long)&message.field_2 + 8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (__return_storage_ptr__,piVar5,(char *)(ulong)uVar2,line);
      std::operator+(&local_128,__return_storage_ptr__,"\n");
      pcVar4 = TestPartResult::message(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,pcVar4);
      std::__cxx11::string::~string((string *)&local_128);
      pcVar4 = test_case_name_local;
      RemoveInvalidXmlCharacters(&local_148,(string *)local_108);
      data = (char *)std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)pcVar4,data);
      std::__cxx11::string::~string((string *)&local_148);
      std::operator<<((ostream *)test_case_name_local,"</failure>\n");
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
  }
  if (part._4_4_ == 0) {
    std::operator<<((ostream *)test_case_name_local," />\n");
  }
  else {
    std::operator<<((ostream *)test_case_name_local,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}